

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::transform(btSoftBody *this,btTransform *trs)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  Node *pNVar7;
  long lVar8;
  long lVar9;
  float extraout_XMM0_Da;
  float fVar10;
  float fVar11;
  btDbvtVolume local_50;
  
  (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
  lVar8 = (long)(this->m_nodes).m_size;
  if (0 < lVar8) {
    lVar9 = 0;
    do {
      pNVar7 = (this->m_nodes).m_data;
      fVar1 = *(float *)((long)(pNVar7->m_x).m_floats + lVar9);
      fVar10 = *(float *)((long)(pNVar7->m_x).m_floats + lVar9 + 4);
      fVar11 = *(float *)((long)(pNVar7->m_x).m_floats + lVar9 + 8);
      fVar2 = (trs->m_basis).m_el[2].m_floats[1];
      fVar3 = (trs->m_basis).m_el[2].m_floats[0];
      fVar4 = (trs->m_basis).m_el[2].m_floats[2];
      uVar6 = *(undefined8 *)(trs->m_origin).m_floats;
      fVar5 = (trs->m_origin).m_floats[2];
      *(ulong *)((long)(pNVar7->m_x).m_floats + lVar9) =
           CONCAT44((float)((ulong)uVar6 >> 0x20) +
                    (trs->m_basis).m_el[1].m_floats[2] * fVar11 +
                    (trs->m_basis).m_el[1].m_floats[0] * fVar1 +
                    (trs->m_basis).m_el[1].m_floats[1] * fVar10,
                    (float)uVar6 +
                    (trs->m_basis).m_el[0].m_floats[2] * fVar11 +
                    (trs->m_basis).m_el[0].m_floats[0] * fVar1 +
                    (trs->m_basis).m_el[0].m_floats[1] * fVar10);
      *(ulong *)((long)(pNVar7->m_x).m_floats + lVar9 + 8) =
           (ulong)(uint)(fVar4 * fVar11 + fVar3 * fVar1 + fVar2 * fVar10 + fVar5);
      fVar1 = *(float *)((long)(pNVar7->m_q).m_floats + lVar9);
      fVar10 = *(float *)((long)(pNVar7->m_q).m_floats + lVar9 + 4);
      fVar11 = *(float *)((long)(pNVar7->m_q).m_floats + lVar9 + 8);
      fVar2 = (trs->m_basis).m_el[2].m_floats[1];
      fVar3 = (trs->m_basis).m_el[2].m_floats[0];
      fVar4 = (trs->m_basis).m_el[2].m_floats[2];
      uVar6 = *(undefined8 *)(trs->m_origin).m_floats;
      fVar5 = (trs->m_origin).m_floats[2];
      *(ulong *)((long)(pNVar7->m_q).m_floats + lVar9) =
           CONCAT44((float)((ulong)uVar6 >> 0x20) +
                    (trs->m_basis).m_el[1].m_floats[2] * fVar11 +
                    (trs->m_basis).m_el[1].m_floats[0] * fVar1 +
                    (trs->m_basis).m_el[1].m_floats[1] * fVar10,
                    (float)uVar6 +
                    (trs->m_basis).m_el[0].m_floats[2] * fVar11 +
                    (trs->m_basis).m_el[0].m_floats[0] * fVar1 +
                    (trs->m_basis).m_el[0].m_floats[1] * fVar10);
      *(ulong *)((long)(pNVar7->m_q).m_floats + lVar9 + 8) =
           (ulong)(uint)(fVar4 * fVar11 + fVar3 * fVar1 + fVar2 * fVar10 + fVar5);
      fVar1 = *(float *)((long)(pNVar7->m_n).m_floats + lVar9);
      fVar10 = *(float *)((long)(pNVar7->m_n).m_floats + lVar9 + 4);
      fVar11 = *(float *)((long)(pNVar7->m_n).m_floats + lVar9 + 8);
      fVar2 = (trs->m_basis).m_el[2].m_floats[1];
      fVar3 = (trs->m_basis).m_el[2].m_floats[0];
      fVar4 = (trs->m_basis).m_el[2].m_floats[2];
      *(ulong *)((long)(pNVar7->m_n).m_floats + lVar9) =
           CONCAT44(fVar11 * (trs->m_basis).m_el[1].m_floats[2] +
                    fVar1 * (trs->m_basis).m_el[1].m_floats[0] +
                    (trs->m_basis).m_el[1].m_floats[1] * fVar10,
                    fVar11 * (trs->m_basis).m_el[0].m_floats[2] +
                    fVar1 * (trs->m_basis).m_el[0].m_floats[0] +
                    (trs->m_basis).m_el[0].m_floats[1] * fVar10);
      *(ulong *)((long)(pNVar7->m_n).m_floats + lVar9 + 8) =
           (ulong)(uint)(fVar11 * fVar4 + fVar1 * fVar3 + fVar10 * fVar2);
      fVar1 = *(float *)((long)(pNVar7->m_x).m_floats + lVar9 + 8);
      uVar6 = *(undefined8 *)((long)(pNVar7->m_x).m_floats + lVar9);
      fVar10 = (float)uVar6;
      fVar11 = (float)((ulong)uVar6 >> 0x20);
      local_50.mi.m_floats[1] = fVar11 - extraout_XMM0_Da;
      local_50.mi.m_floats[0] = fVar10 - extraout_XMM0_Da;
      local_50.mi.m_floats[2] = fVar1 - extraout_XMM0_Da;
      local_50.mi.m_floats[3] = 0.0;
      local_50.mx.m_floats[1] = fVar11 + extraout_XMM0_Da;
      local_50.mx.m_floats[0] = fVar10 + extraout_XMM0_Da;
      local_50.mx.m_floats[2] = fVar1 + extraout_XMM0_Da;
      local_50.mx.m_floats[3] = 0.0;
      btDbvt::update(&this->m_ndbvt,*(btDbvtNode **)((long)(&pNVar7->m_n + 1) + lVar9 + 8),&local_50
                    );
      lVar9 = lVar9 + 0x78;
    } while (lVar8 * 0x78 - lVar9 != 0);
  }
  updateNormals(this);
  updateBounds(this);
  updateConstants(this);
  uVar6 = *(undefined8 *)((trs->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_initialWorldTransform).m_basis.m_el[0].m_floats =
       *(undefined8 *)(trs->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_initialWorldTransform).m_basis.m_el[0].m_floats + 2) = uVar6;
  uVar6 = *(undefined8 *)((trs->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_initialWorldTransform).m_basis.m_el[1].m_floats =
       *(undefined8 *)(trs->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_initialWorldTransform).m_basis.m_el[1].m_floats + 2) = uVar6;
  uVar6 = *(undefined8 *)((trs->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_initialWorldTransform).m_basis.m_el[2].m_floats =
       *(undefined8 *)(trs->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_initialWorldTransform).m_basis.m_el[2].m_floats + 2) = uVar6;
  uVar6 = *(undefined8 *)((trs->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_initialWorldTransform).m_origin.m_floats =
       *(undefined8 *)(trs->m_origin).m_floats;
  *(undefined8 *)((this->m_initialWorldTransform).m_origin.m_floats + 2) = uVar6;
  return;
}

Assistant:

void			btSoftBody::transform(const btTransform& trs)
{
	const btScalar	margin=getCollisionShape()->getMargin();
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	vol;
	
	for(int i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		n.m_x=trs*n.m_x;
		n.m_q=trs*n.m_q;
		n.m_n=trs.getBasis()*n.m_n;
		vol = btDbvtVolume::FromCR(n.m_x,margin);
		
		m_ndbvt.update(n.m_leaf,vol);
	}
	updateNormals();
	updateBounds();
	updateConstants();
	m_initialWorldTransform = trs;
}